

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_inst.h
# Opt level: O0

void __thiscall
mocker::ir::Call::Call<std::shared_ptr<mocker::ir::Addr>>
          (Call *this,string *funcName,shared_ptr<mocker::ir::Addr> *args)

{
  initializer_list<std::shared_ptr<mocker::ir::Addr>_> __l;
  shared_ptr<mocker::ir::Addr> *local_b8;
  allocator<std::shared_ptr<mocker::ir::Addr>_> local_51;
  shared_ptr<mocker::ir::Addr> local_50;
  shared_ptr<mocker::ir::Addr> local_40;
  shared_ptr<mocker::ir::Reg> local_30;
  shared_ptr<mocker::ir::Addr> *local_20;
  shared_ptr<mocker::ir::Addr> *args_local;
  string *funcName_local;
  Call *this_local;
  
  local_20 = args;
  args_local = (shared_ptr<mocker::ir::Addr> *)funcName;
  funcName_local = (string *)this;
  IRInst::IRInst(&this->super_IRInst,Call);
  std::shared_ptr<mocker::ir::Reg>::shared_ptr(&local_30,(nullptr_t)0x0);
  Definition::Definition(&this->super_Definition,&local_30);
  std::shared_ptr<mocker::ir::Reg>::~shared_ptr(&local_30);
  (this->super_IRInst)._vptr_IRInst = (_func_int **)&PTR__Call_0039b2b0;
  (this->super_Definition)._vptr_Definition = (_func_int **)&PTR__Call_0039b2d0;
  std::__cxx11::string::string((string *)&this->funcName,(string *)funcName);
  std::shared_ptr<mocker::ir::Addr>::shared_ptr(&local_50,args);
  local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_50;
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::allocator(&local_51);
  __l._M_len = (size_type)
               local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  __l._M_array = (iterator)
                 local_40.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>::
  vector(&this->args,__l,&local_51);
  std::allocator<std::shared_ptr<mocker::ir::Addr>_>::~allocator(&local_51);
  local_b8 = &local_40;
  do {
    local_b8 = local_b8 + -1;
    std::shared_ptr<mocker::ir::Addr>::~shared_ptr(local_b8);
  } while (local_b8 != &local_50);
  return;
}

Assistant:

explicit Call(std::string funcName, Args... args)
      : IRInst(InstType::Call), Definition(nullptr),
        funcName(std::move(funcName)), args({std::move(args)...}) {}